

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

llb_build_key_t * llb_build_key_make_custom_task(char *name,char *taskData)

{
  CAPIBuildKey *this;
  size_t sVar1;
  size_t sVar2;
  StringRef name_00;
  StringRef taskData_00;
  BuildKey BStack_48;
  
  this = (CAPIBuildKey *)operator_new(0x38);
  if (name == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(name);
  }
  if (taskData == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(taskData);
  }
  name_00.Length = sVar1;
  name_00.Data = name;
  taskData_00.Length = sVar2;
  taskData_00.Data = taskData;
  llbuild::buildsystem::BuildKey::makeCustomTask(&BStack_48,name_00,taskData_00);
  anon_unknown.dwarf_243886::CAPIBuildKey::CAPIBuildKey(this,&BStack_48);
  std::__cxx11::string::_M_dispose();
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_custom_task(const char *name, const char *taskData) {
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeCustomTask(StringRef(name), StringRef(taskData)));
}